

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O2

plutovg_color_t resolve_current_color(render_context_t *context,element_t *element)

{
  plutovg_color_t pVar1;
  color_t color;
  
  color.type = color_type_current;
  color.value = 0;
  parse_color(element,4,&color,true);
  if (color.type == color_type_fixed) {
    pVar1 = convert_color(&color);
  }
  else if (element->parent == (element_t *)0x0) {
    if (context->current_color == (plutovg_color_t *)0x0) {
      pVar1 = (plutovg_color_t)(ZEXT816(0x3f80000000000000) << 0x40);
    }
    else {
      pVar1 = *context->current_color;
    }
  }
  else {
    pVar1 = resolve_current_color(context,element->parent);
  }
  return pVar1;
}

Assistant:

static plutovg_color_t resolve_current_color(const render_context_t* context, const element_t* element)
{
    color_t color = {color_type_current};
    parse_color(element, ATTR_COLOR, &color, true);
    if(color.type == color_type_fixed)
        return convert_color(&color);
    if(element->parent == NULL) {
        if(context->current_color)
            return *context->current_color;
        return PLUTOVG_BLACK_COLOR;
    }

    return resolve_current_color(context, element->parent);
}